

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CESkyCoord * __thiscall
CESkyCoord::ConvertToICRS(CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CEObserver *in_RDX;
  CEDate *in_RSI;
  CESkyCoord *in_RDI;
  CESkyCoord *unaff_retaddr;
  CESkyCoord *icrs;
  CESkyCoord *in_stack_000000c8;
  CESkyCoord *in_stack_000000d0;
  CEDate *in_stack_000000e0;
  CESkyCoord *in_stack_000000e8;
  CEDate *in_stack_000000f0;
  CESkyCoord *in_stack_000000f8;
  CESkyCoord *in_stack_00000100;
  CESkyCoord *in_stack_ffffffffffffffa8;
  CESkyCoord *this_00;
  CESkyCoord *in_stack_ffffffffffffffd0;
  CEDate *date_00;
  CESkyCoord *out_icrs;
  
  this_00 = in_RDI;
  date_00 = in_RSI;
  out_icrs = in_RDI;
  CESkyCoord(in_stack_ffffffffffffffd0);
  if (*(int *)&(in_RSI->gregorian_date_vect_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish == 0) {
    CIRS2ICRS((CESkyCoord *)in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 1) {
    SetCoordinates(this_00,in_stack_ffffffffffffffa8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 2) {
    Galactic2ICRS(in_stack_000000d0,in_stack_000000c8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 3) {
    Observed2ICRS(unaff_retaddr,out_icrs,date_00,in_RDX);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 4) {
    Ecliptic2ICRS(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  }
  return in_RDI;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToICRS(const CEDate&     date,
                                     const CEObserver& observer)
{
    // Create return coordinate
    CESkyCoord icrs;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> ICRS
        CIRS2ICRS(*this, &icrs, date);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> ICRS
        icrs.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> ICRS
        Galactic2ICRS(*this, &icrs);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> ICRS
        Observed2ICRS(*this, &icrs, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> ICRS
        Ecliptic2ICRS(*this, &icrs, date);
    }
    
    return icrs;
}